

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void vkt::sr::anon_unknown_0::evalSubscriptMat2x3(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  undefined8 local_30;
  undefined4 local_28;
  float local_24;
  undefined8 local_20;
  int aiStack_18 [6];
  
  local_30 = *(undefined8 *)(c->coords).m_data;
  local_24 = (float)((ulong)local_30 >> 0x20);
  local_20 = *(undefined8 *)((c->coords).m_data + 2);
  local_28 = (int)local_20;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = (&local_24)[lVar1] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  res_1.m_data[2] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = *(float *)((long)&local_30 + lVar1 * 4) + res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar1]] = res.m_data[lVar1 + 2];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }